

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu.cpp
# Opt level: O2

int __thiscall ncnn::GELU::forward_inplace(GELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  long lVar5;
  int q;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  float fVar9;
  
  uVar2 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar8 = bottom_top_blob->data;
  lVar5 = bottom_top_blob->elemsize * bottom_top_blob->cstep;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = 0;
  }
  if (this->fast_gelu == 0) {
    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = *(float *)((long)pvVar8 + uVar4 * 4);
        fVar9 = erfcf(fVar1 * -0.70710677);
        *(float *)((long)pvVar8 + uVar4 * 4) = fVar9 * fVar1 * 0.5;
      }
      pvVar8 = (void *)((long)pvVar8 + lVar5);
    }
  }
  else {
    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = *(float *)((long)pvVar8 + uVar4 * 4);
        fVar9 = tanhf((fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * 0.7978845);
        *(float *)((long)pvVar8 + uVar4 * 4) = (fVar9 + 1.0) * fVar1 * 0.5;
      }
      pvVar8 = (void *)((long)pvVar8 + lVar5);
    }
  }
  return 0;
}

Assistant:

int GELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    if (fast_gelu)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
                ptr[i] = 0.5f * ptr[i] * (1.0f + tanhf(0.79788452f * (ptr[i] + 0.044715f * ptr[i] * ptr[i] * ptr[i])));
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = x * P(X <= x) where X ~ N(0, 1)
                ptr[i] = 0.5f * ptr[i] * erfcf(-0.70710678f * ptr[i]);
            }
        }
    }

    return 0;
}